

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::IStreamingReporter::listReporters
          (IStreamingReporter *this,
          vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
          *descriptions,IConfig *config)

{
  pointer pRVar1;
  pointer pcVar2;
  int iVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char local_f9;
  Column local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_t local_a0;
  Column local_98;
  size_t local_60;
  size_type local_58;
  IConfig *local_50;
  Columns local_48;
  
  local_50 = config;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available reporters:\n",0x15);
  pRVar7 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pRVar4 = pRVar7 + 1;
  pRVar5 = pRVar7;
  pRVar6 = pRVar7;
  if (pRVar4 != pRVar1 && pRVar7 != pRVar1) {
    do {
      pRVar5 = pRVar4;
      if ((pRVar4->name)._M_string_length <= (pRVar6->name)._M_string_length) {
        pRVar5 = pRVar6;
      }
      pRVar4 = pRVar4 + 1;
      pRVar6 = pRVar5;
    } while (pRVar4 != pRVar1);
  }
  if (pRVar7 != pRVar1) {
    local_58 = (pRVar5->name)._M_string_length;
    local_a0 = local_58 + 5;
    local_60 = 0x48 - local_58;
    do {
      iVar3 = (*local_50->_vptr_IConfig[0x14])();
      if (iVar3 == 0) {
        local_f8.m_string._M_dataplus._M_p = (pointer)&local_f8.m_string.field_2;
        pcVar2 = (pRVar7->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,pcVar2,pcVar2 + (pRVar7->name)._M_string_length);
        local_f8.m_width = 0x4f;
        local_f8.m_initialIndent = 0xffffffffffffffff;
        local_f8.m_indent = 2;
        if (local_a0 == 0) goto LAB_00148d50;
        local_f8.m_width = local_a0;
        TextFlow::operator<<((ostream *)&std::cout,&local_f8);
        local_98.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_98,1);
        uVar8 = local_f8.m_string.field_2._M_allocated_capacity;
        _Var9._M_p = local_f8.m_string._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.m_string._M_dataplus._M_p != &local_f8.m_string.field_2) {
LAB_00148cfb:
          operator_delete(_Var9._M_p,uVar8 + 1);
        }
      }
      else {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        pcVar2 = (pRVar7->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar2,pcVar2 + (pRVar7->name)._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_c0,":");
        local_f8.m_string._M_dataplus._M_p = (pointer)&local_f8.m_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        local_f8.m_width = 0x4f;
        local_f8.m_initialIndent = 0xffffffffffffffff;
        local_f8.m_indent = 2;
        if (local_a0 == 0) {
LAB_00148d50:
          __assert_fail("newWidth > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                        ,0x2269,"Column &Catch::TextFlow::Column::width(size_t)");
        }
        local_f8.m_width = local_a0;
        local_98.m_string._M_dataplus._M_p = (pointer)&local_98.m_string.field_2;
        pcVar2 = (pRVar7->description)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar2,pcVar2 + (pRVar7->description)._M_string_length);
        local_98.m_width = 0x4f;
        local_98.m_initialIndent = 0;
        local_98.m_indent = 2;
        if (local_58 == 0x48) goto LAB_00148d50;
        local_98.m_width = local_60;
        TextFlow::Column::operator+(&local_48,&local_f8,&local_98);
        TextFlow::operator<<((ostream *)&std::cout,&local_48);
        local_f9 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_f9,1);
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                  (&local_48.m_columns);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.m_string._M_dataplus._M_p != &local_98.m_string.field_2) {
          operator_delete(local_98.m_string._M_dataplus._M_p,
                          local_98.m_string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.m_string._M_dataplus._M_p != &local_f8.m_string.field_2) {
          operator_delete(local_f8.m_string._M_dataplus._M_p,
                          local_f8.m_string.field_2._M_allocated_capacity + 1);
        }
        uVar8 = local_c0.field_2._M_allocated_capacity;
        _Var9._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_00148cfb;
      }
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != pRVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  return;
}

Assistant:

void IStreamingReporter::listReporters(std::vector<ReporterDescription> const &descriptions, IConfig const &config) {
        Catch::cout() << "Available reporters:\n";
        const auto maxNameLen = std::max_element(descriptions.begin(), descriptions.end(),
            [](ReporterDescription const &lhs, ReporterDescription const &rhs) { return lhs.name.size() < rhs.name.size(); })
            ->name.size();

        for (auto const &desc : descriptions) {
            if (config.verbosity() == Verbosity::Quiet) {
                Catch::cout()
                    << TextFlow::Column(desc.name)
                    .indent(2)
                    .width(5 + maxNameLen) << '\n';
            }
            else {
                Catch::cout()
                    << TextFlow::Column(desc.name + ":")
                    .indent(2)
                    .width(5 + maxNameLen)
                    + TextFlow::Column(desc.description)
                    .initialIndent(0)
                    .indent(2)
                    .width(CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8)
                    << '\n';
            }
        }
        Catch::cout() << std::endl;
    }